

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O1

void __thiscall TRM::SWRaster::render_quad_to(SWRaster *this,float cx,float cy,float x2,float y2)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  unsigned_long uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *paVar12;
  float fVar13;
  
  paVar12 = &this->m_bez_stack;
  fVar13 = (float)up_scale<float>(float)::scale;
  (this->m_bez_stack)._M_elems[0].field_0.x = (int)(x2 * fVar13);
  (this->m_bez_stack)._M_elems[0].field_1.y = (int)(y2 * fVar13);
  (this->m_bez_stack)._M_elems[1].field_0.x = (int)(cx * fVar13);
  (this->m_bez_stack)._M_elems[1].field_1.y = (int)(cy * fVar13);
  uVar5 = (int)(x2 * fVar13) + (int)(cx * fVar13) * -2 + this->m_x;
  uVar8 = -uVar5;
  if (0 < (int)uVar5) {
    uVar8 = uVar5;
  }
  iVar7 = this->m_y;
  uVar3 = (int)(y2 * fVar13) + (int)(cy * fVar13) * -2 + iVar7;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  if (uVar5 < uVar8) {
    uVar5 = uVar8;
  }
  (this->m_bez_stack)._M_elems[2].field_0.x = this->m_x;
  (this->m_bez_stack)._M_elems[2].field_1.y = iVar7;
  iVar7 = 0;
  if (uVar5 < 0x40) goto LAB_00115d79;
  uVar4 = 0;
  uVar6 = (ulong)uVar5;
  do {
    uVar6 = uVar6 >> 2;
    uVar4 = uVar4 + 1;
    bVar2 = 0x103 < uVar5;
    uVar5 = (uint)uVar6;
  } while (bVar2);
  (this->m_lev_stack)._M_elems[0] = uVar4;
  uVar6 = 0;
  do {
    iVar7 = (int)uVar6;
    uVar4 = (this->m_lev_stack)._M_elems[uVar6];
    if (uVar4 == 0) {
LAB_00115d79:
      render_line(this,paVar12->_M_elems[0].field_0.x,paVar12->_M_elems[0].field_1.y);
      uVar8 = iVar7 - 1;
      paVar12 = (array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *)((long)(paVar12 + -1) + 0x2f8);
    }
    else {
      iVar1 = paVar12->_M_elems[2].field_0.x;
      paVar12->_M_elems[4].field_0.x = iVar1;
      iVar9 = paVar12->_M_elems[1].field_0.x;
      iVar10 = paVar12->_M_elems[1].field_1.y;
      iVar11 = paVar12->_M_elems[0].field_0.x + iVar9;
      iVar9 = iVar9 + iVar1;
      paVar12->_M_elems[3].field_0.x = iVar9 >> 1;
      paVar12->_M_elems[2].field_0.x = iVar11 + iVar9 >> 2;
      paVar12->_M_elems[1].field_0.x = iVar11 >> 1;
      iVar1 = paVar12->_M_elems[2].field_1.y;
      paVar12->_M_elems[4].field_1.y = iVar1;
      iVar9 = paVar12->_M_elems[0].field_1.y + iVar10;
      iVar10 = iVar10 + iVar1;
      paVar12->_M_elems[3].field_1.y = iVar10 >> 1;
      paVar12->_M_elems[2].field_1.y = iVar9 + iVar10 >> 2;
      paVar12->_M_elems[1].field_1.y = iVar9 >> 1;
      paVar12 = (array<glm::vec<2,_int,_(glm::qualifier)0>,_97UL> *)(paVar12->_M_elems + 2);
      uVar8 = iVar7 + 1;
      uVar4 = uVar4 - 1;
      (this->m_lev_stack)._M_elems[uVar6] = uVar4;
      (this->m_lev_stack)._M_elems[uVar6 + 1] = uVar4;
    }
    uVar6 = (ulong)uVar8;
  } while (-1 < (int)uVar8);
  return;
}

Assistant:

void SWRaster::render_quad_to(float cx, float cy, float x2, float y2) {
  auto levels = m_lev_stack.data();
  auto arc = m_bez_stack.data();
  size_t level = 0;
  int32_t min, max, y;

  arc[0].x = up_scale(x2);
  arc[0].y = up_scale(y2);
  arc[1].x = up_scale(cx);
  arc[1].y = up_scale(cy);
  arc[2].x = m_x;
  arc[2].y = m_y;
  int32_t top = 0;

  int32_t dx = std::abs(arc[2].x + arc[0].x - 2 * arc[1].x);
  int32_t dy = std::abs(arc[2].y + arc[0].y - 2 * arc[1].y);

  if (dx < dy) {
    dx = dy;
  }

  if (dx < ONE_PIXEL / 4) {
    goto DRAW;
  }

  level = 0;
  do {
    dx >>= 2;
    level++;
  } while (dx > ONE_PIXEL / 4);

  levels[0] = level;

  do {
    level = levels[top];
    if (level > 0) {
      sw_split_conic(arc);
      arc += 2;
      top++;
      levels[top] = levels[top - 1] = level - 1;
      continue;
    }
  DRAW:
    render_line(arc[0].x, arc[0].y);
    top--;
    arc -= 2;
  } while (top >= 0);
}